

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# result-c.cpp
# Opt level: O2

duckdb_blob duckdb::CBlobConverter::Convert<duckdb::string_t,duckdb_blob>(string_t input)

{
  undefined1 *in_RSI;
  uint in_EDI;
  duckdb_blob dVar1;
  undefined1 auStack_34 [12];
  
  dVar1.data = malloc((ulong)in_EDI);
  if (in_EDI < 0xd) {
    in_RSI = auStack_34;
  }
  switchD_00916250::default(dVar1.data,in_RSI,(ulong)in_EDI);
  dVar1.size._0_4_ = in_EDI;
  dVar1.size._4_4_ = 0;
  return dVar1;
}

Assistant:

static DST Convert(SRC input) {
		duckdb_blob result;
		result.data = char_ptr_cast(duckdb_malloc(input.GetSize()));
		result.size = input.GetSize();
		assert(result.data);
		memcpy(result.data, input.GetData(), input.GetSize());
		return result;
	}